

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgnometheme.cpp
# Opt level: O2

QVariant * __thiscall
QGnomeTheme::themeHint(QVariant *__return_storage_ptr__,QGnomeTheme *this,ThemeHint hint)

{
  QSize QVar1;
  int iVar2;
  QArrayDataPointer<QSize> *this_00;
  long in_FS_OFFSET;
  initializer_list<Qt::Key> args;
  QArrayDataPointer<char16_t> local_c0;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<QSize> local_78;
  QArrayDataPointer<QSize> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(hint) {
  case SystemIconThemeName:
    local_78.ptr = (QSize *)0x617b62;
    local_78.size = 7;
    goto LAB_0058814c;
  case SystemIconFallbackThemeName:
    local_78.ptr = (QSize *)0x617b72;
    local_78.size = 5;
LAB_0058814c:
    local_58.size = 0;
    local_58.ptr = (QSize *)0x0;
    local_58.d = (Data *)0x0;
    local_78.d = (Data *)0x0;
    this_00 = &local_58;
    ::QVariant::QVariant(__return_storage_ptr__,(QString *)&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
LAB_00588162:
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_00);
    goto LAB_00588221;
  case IconThemeSearchPaths:
    QGenericUnixTheme::xdgIconThemePaths();
    goto LAB_0058820e;
  case StyleNames:
    local_78.d = (Data *)0x0;
    local_78.ptr = (QSize *)0x0;
    local_78.size = 0;
    local_58.d = (Data *)0x0;
    local_90.d = (Data *)0x0;
    local_90.ptr = (char16_t *)0x0;
    local_58.ptr = (QSize *)0x6177b8;
    local_90.size = 0;
    local_58.size = 6;
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_78,(QString *)&local_58);
    local_a8.d = (Data *)0x0;
    local_c0.d = (Data *)0x0;
    local_c0.ptr = (char16_t *)0x0;
    local_a8.ptr = L"windows";
    local_c0.size = 0;
    local_a8.size = 7;
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_78,(QString *)&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
LAB_0058820e:
    ::QVariant::QVariant(__return_storage_ptr__,(QList_conflict1 *)&local_78);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_78);
    goto LAB_00588221;
  default:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QPlatformTheme::themeHint(__return_storage_ptr__,(QPlatformTheme *)this,hint);
      return __return_storage_ptr__;
    }
    break;
  case DialogButtonBoxLayout:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      iVar2 = 3;
LAB_005882ab:
      ::QVariant::QVariant(__return_storage_ptr__,iVar2);
      return __return_storage_ptr__;
    }
    break;
  case DialogButtonBoxButtonsHaveIcons:
  case PreselectFirstFileInDirectory:
  case PreferFileIconFromTheme:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      ::QVariant::QVariant(__return_storage_ptr__,true);
      return __return_storage_ptr__;
    }
    break;
  case KeyboardScheme:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      iVar2 = 4;
      goto LAB_005882ab;
    }
    break;
  case UiEffects:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      iVar2 = 0x80;
      goto LAB_005882ab;
    }
    break;
  case IconPixmapSizes:
    QGenericUnixTheme::availableXdgFileIconSizes();
    ::QVariant::fromValue<QList<QSize>,_true>(__return_storage_ptr__,(QList<QSize> *)&local_78);
    QArrayDataPointer<QSize>::~QArrayDataPointer(&local_78);
    goto LAB_00588221;
  case PasswordMaskCharacter:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      ::QVariant::QVariant(__return_storage_ptr__,(QChar)0x2022);
      return __return_storage_ptr__;
    }
    break;
  case ButtonPressKeys:
    local_58.d = (Data *)0x100000400000020;
    local_58.ptr = (QSize *)0x101000001000005;
    args._M_len = 4;
    args._M_array = (iterator)&local_58;
    QList<Qt::Key>::QList((QList<Qt::Key> *)&local_78,args);
    ::QVariant::fromValue<QList<Qt::Key>,_true>(__return_storage_ptr__,(QList<Qt::Key> *)&local_78);
    QArrayDataPointer<Qt::Key>::~QArrayDataPointer((QArrayDataPointer<Qt::Key> *)&local_78);
LAB_00588221:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return __return_storage_ptr__;
    }
    break;
  case MouseCursorTheme:
    this_00 = &local_78;
    QGenericUnixTheme::mouseCursorTheme();
    ::QVariant::QVariant(__return_storage_ptr__,(QString *)this_00);
    goto LAB_00588162;
  case MouseCursorSize:
    QVar1 = QGenericUnixTheme::mouseCursorSize();
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      ::QVariant::QVariant(__return_storage_ptr__,QVar1);
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QVariant QGnomeTheme::themeHint(QPlatformTheme::ThemeHint hint) const
{
    switch (hint) {
    case QPlatformTheme::DialogButtonBoxButtonsHaveIcons:
        return QVariant(true);
    case QPlatformTheme::DialogButtonBoxLayout:
        return QVariant(QPlatformDialogHelper::GnomeLayout);
    case QPlatformTheme::SystemIconThemeName:
        return QVariant(QStringLiteral("Adwaita"));
    case QPlatformTheme::SystemIconFallbackThemeName:
        return QVariant(QStringLiteral("gnome"));
    case QPlatformTheme::IconThemeSearchPaths:
        return QVariant(xdgIconThemePaths());
    case QPlatformTheme::IconPixmapSizes:
        return QVariant::fromValue(availableXdgFileIconSizes());
    case QPlatformTheme::StyleNames: {
        QStringList styleNames;
        styleNames << QStringLiteral("Fusion") << QStringLiteral("windows");
        return QVariant(styleNames);
    }
    case QPlatformTheme::KeyboardScheme:
        return QVariant(int(GnomeKeyboardScheme));
    case QPlatformTheme::PasswordMaskCharacter:
        return QVariant(QChar(0x2022));
    case QPlatformTheme::UiEffects:
        return QVariant(int(HoverEffect));
    case QPlatformTheme::ButtonPressKeys:
        return QVariant::fromValue(
                QList<Qt::Key>({ Qt::Key_Space, Qt::Key_Return, Qt::Key_Enter, Qt::Key_Select }));
    case QPlatformTheme::PreselectFirstFileInDirectory:
        return true;
    case QPlatformTheme::MouseCursorTheme:
        return QVariant(mouseCursorTheme());
    case QPlatformTheme::MouseCursorSize:
        return QVariant(mouseCursorSize());
    case QPlatformTheme::PreferFileIconFromTheme:
        return true;
    default:
        break;
    }
    return QPlatformTheme::themeHint(hint);
}